

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_blockcb.c
# Opt level: O0

void test_packet1(void)

{
  cunit_start_test("test_packet1");
  rfc5444_reader_handle_packet(&reader,testpacket1,5);
  cunit_named_check((_Bool)(got_tlv[0] & 1),"test_packet1",0x87,"TLV 1");
  cunit_named_check((_Bool)((got_tlv[1] ^ 0xffU) & 1),"test_packet1",0x88,"TLV 2");
  cunit_named_check((_Bool)((got_multiple_times[0] ^ 0xffU) & 1),"test_packet1",0x8a,
                    "TLV 1 (duplicate)");
  cunit_named_check((_Bool)((got_multiple_times[1] ^ 0xffU) & 1),"test_packet1",0x8b,
                    "TLV 2 (duplicate)");
  cunit_named_check((_Bool)(got_failed_constraints & 1),"test_packet1",0x8d,"mandatory missing");
  cunit_end_test("test_packet1");
  return;
}

Assistant:

static void test_packet1(void) {
  START_TEST();

  rfc5444_reader_handle_packet(&reader, testpacket1, sizeof(testpacket1));

  CHECK_TRUE(got_tlv[0], "TLV 1");
  CHECK_TRUE(!got_tlv[1], "TLV 2");

  CHECK_TRUE(!got_multiple_times[0], "TLV 1 (duplicate)");
  CHECK_TRUE(!got_multiple_times[1], "TLV 2 (duplicate)");

  CHECK_TRUE(got_failed_constraints, "mandatory missing");
  END_TEST();
}